

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter.cpp
# Opt level: O1

bool __thiscall E64::blitter_ic::run_next_operation(blitter_ic *this)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = this->head;
  uVar2 = this->tail;
  if (uVar1 != uVar2) {
    switch(this->operations[uVar2].type) {
    case CLEAR:
      clear_framebuffer(this);
      break;
    case HOR_BORDER:
      draw_horizontal_border(this);
      break;
    case VER_BORDER:
      draw_vertical_border(this);
      break;
    case BLIT:
      draw_blit(this,&this->operations[uVar2].blit);
    }
    this->tail = this->tail + 1;
  }
  return uVar1 != uVar2;
}

Assistant:

bool E64::blitter_ic::run_next_operation()
{
	if (head != tail) {
		switch (operations[tail].type) {
			case CLEAR:
				clear_framebuffer();
				break;
			case HOR_BORDER:
				draw_horizontal_border();
				break;
			case VER_BORDER:
				draw_vertical_border();
				break;
			case BLIT:
				draw_blit(&operations[tail].blit);
				break;
		}
		tail++;
		return true;
	} else {
		return false;
	}
}